

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O3

string * __thiscall
deqp::sl::ShaderParser::parseShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderParser *this,char *str)

{
  ostringstream *poVar1;
  byte bVar2;
  string *psVar3;
  ostringstream oVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ostringstream *poVar10;
  ostringstream o;
  byte local_349;
  long *local_348;
  int local_340;
  long local_338 [2];
  string *local_328;
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  poVar10 = (ostringstream *)(str + 1);
  do {
    oVar4 = poVar10[1];
    poVar10 = poVar10 + 1;
  } while (oVar4 == (ostringstream)0x20);
  while ((oVar4 == (ostringstream)0xa || (oVar4 == (ostringstream)0xd))) {
    poVar1 = poVar10 + 1;
    poVar10 = poVar10 + 1;
    oVar4 = *poVar1;
  }
  do {
    if (oVar4 == (ostringstream)0x5c) {
      oVar4 = poVar10[1];
      if (oVar4 != (ostringstream)0x0) {
        if (oVar4 == (ostringstream)0x74) {
          local_320[0] = (ostringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,1);
        }
        else if (oVar4 == (ostringstream)0x6e) {
          local_320[0] = (ostringstream)0xa;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,1);
        }
        else {
          local_320[0] = oVar4;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,1);
        }
      }
      poVar10 = poVar10 + 2;
    }
    else {
      if ((oVar4 == (ostringstream)0x22) && (poVar10[1] == (ostringstream)0x22)) break;
      local_320[0] = oVar4;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,1);
      poVar10 = poVar10 + 1;
    }
    oVar4 = *poVar10;
  } while( true );
  std::__cxx11::stringbuf::str();
  lVar6 = 0;
  iVar8 = 0;
  while( true ) {
    bVar2 = *(byte *)((long)local_348 + lVar6);
    if ((((0x20 < (ulong)bVar2) || ((0x100002200U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) &&
        (bVar2 != 10)) || (local_340 <= lVar6)) break;
    iVar8 = iVar8 + (uint)(bVar2 == 9) * 3 + 1;
    lVar6 = lVar6 + 1;
  }
  local_328 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  if (0 < local_340) {
    bVar5 = true;
    iVar7 = 0;
    iVar9 = 0;
    do {
      bVar2 = *(byte *)((long)local_348 + (long)iVar7);
      if ((bVar5) && (iVar9 < iVar8)) {
        if (bVar2 < 0xd) {
          if (bVar2 == 9) {
LAB_00d9952e:
            iVar9 = iVar9 + (uint)(bVar2 == 9) * 3 + 1;
            goto LAB_00d99580;
          }
          if (bVar2 == 10) goto LAB_00d99569;
        }
        else {
          if (bVar2 == 0xd) goto LAB_00d99541;
          if (bVar2 == 0x20) goto LAB_00d9952e;
        }
LAB_00d99584:
        local_349 = bVar2;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)&local_349,1);
        bVar5 = false;
      }
      else if (bVar2 == 10) {
LAB_00d99569:
        local_349 = bVar2;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)&local_349,1);
        iVar9 = 0;
LAB_00d99580:
        bVar5 = true;
      }
      else {
        if (bVar2 != 0xd) goto LAB_00d99584;
LAB_00d99541:
        if (*(char *)((long)local_348 + (long)iVar7 + 1) != '\n') goto LAB_00d99569;
        local_349 = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)&local_349,1);
        iVar7 = iVar7 + 1;
        iVar9 = 0;
        bVar5 = true;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_340);
  }
  psVar3 = local_328;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  if (local_348 != local_338) {
    operator_delete(local_348,local_338[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar3;
}

Assistant:

string ShaderParser::parseShaderSource(const char* str)
{
	const char*   p = str + 2;
	ostringstream o;

	// Eat first empty line from beginning.
	while (*p == ' ')
		p++;
	while (isEOL(*p))
		p++;

	while ((p[0] != '"') || (p[1] != '"'))
	{
		if (*p == '\\')
		{
			switch (p[1])
			{
			case 0:
				DE_ASSERT(DE_FALSE);
				break;
			case 'n':
				o << '\n';
				break;
			case 't':
				o << '\t';
				break;
			default:
				o << p[1];
				break;
			}

			p += 2;
		}
		else
			o << *p++;
	}

	return removeExtraIndentation(o.str());
}